

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O1

void __thiscall
opengv::absolute_pose::modules::Epnp::relative_error
          (Epnp *this,double *rot_err,double *transl_err,double (*Rtrue) [3],double *ttrue,
          double (*Rest) [3],double *test)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double qest [4];
  double qtrue [4];
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  mat_to_quat(this,Rtrue,&local_58);
  mat_to_quat(this,Rest,&local_78);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_58 - local_78;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (local_50 - local_70) * (local_50 - local_70);
  auVar3 = vfmadd231sd_fma(auVar8,auVar3,auVar3);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_48 - local_68;
  auVar3 = vfmadd213sd_fma(auVar21,auVar21,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_40 - local_60;
  auVar3 = vfmadd213sd_fma(auVar4,auVar4,auVar3);
  if (auVar3._0_8_ < 0.0) {
    auVar14._0_8_ = sqrt(auVar3._0_8_);
    auVar14._8_56_ = extraout_var;
    auVar3 = auVar14._0_16_;
  }
  else {
    auVar3 = vsqrtsd_avx(auVar3,auVar3);
  }
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_40;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_48;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_58;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_50 * local_50;
  auVar4 = vfmadd231sd_fma(auVar5,auVar23,auVar23);
  auVar4 = vfmadd231sd_fma(auVar4,auVar24,auVar24);
  auVar4 = vfmadd231sd_fma(auVar4,auVar25,auVar25);
  auVar9._0_8_ = auVar4._0_8_;
  if (auVar9._0_8_ < 0.0) {
    auVar15._0_8_ = sqrt(auVar9._0_8_);
    auVar15._8_56_ = extraout_var_00;
    auVar4 = auVar15._0_16_;
  }
  else {
    auVar4 = vsqrtsd_avx(auVar4,auVar4);
  }
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_58 + local_78;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = (local_50 + local_70) * (local_50 + local_70);
  auVar8 = vfmadd231sd_fma(auVar18,auVar6,auVar6);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_48 + local_68;
  auVar8 = vfmadd213sd_fma(auVar22,auVar22,auVar8);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_40 + local_60;
  auVar8 = vfmadd213sd_fma(auVar7,auVar7,auVar8);
  if (auVar8._0_8_ < 0.0) {
    auVar16._0_8_ = sqrt(auVar8._0_8_);
    auVar16._8_56_ = extraout_var_01;
    auVar8 = auVar16._0_16_;
  }
  else {
    auVar8 = vsqrtsd_avx(auVar8,auVar8);
  }
  auVar9._8_8_ = 0;
  if (auVar9._0_8_ < 0.0) {
    auVar17._0_8_ = sqrt(auVar9._0_8_);
    auVar17._8_56_ = extraout_var_02;
    auVar21 = auVar17._0_16_;
  }
  else {
    auVar21 = vsqrtsd_avx(auVar9,auVar9);
  }
  auVar4 = vunpcklpd_avx(auVar21,auVar4);
  auVar3 = vunpcklpd_avx(auVar8,auVar3);
  auVar3 = vdivpd_avx(auVar3,auVar4);
  auVar4 = vshufpd_avx(auVar3,auVar3,1);
  auVar3 = vminsd_avx(auVar3,auVar4);
  *rot_err = auVar3._0_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *ttrue - *test;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = (ttrue[1] - test[1]) * (ttrue[1] - test[1]);
  auVar3 = vfmadd231sd_fma(auVar19,auVar10,auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = ttrue[2] - test[2];
  auVar3 = vfmadd213sd_fma(auVar11,auVar11,auVar3);
  if (auVar3._0_8_ < 0.0) {
    dVar1 = sqrt(auVar3._0_8_);
  }
  else {
    auVar3 = vsqrtsd_avx(auVar3,auVar3);
    dVar1 = auVar3._0_8_;
  }
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *ttrue;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = ttrue[1] * ttrue[1];
  auVar3 = vfmadd231sd_fma(auVar20,auVar12,auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = ttrue[2];
  auVar3 = vfmadd213sd_fma(auVar13,auVar13,auVar3);
  if (auVar3._0_8_ < 0.0) {
    dVar2 = sqrt(auVar3._0_8_);
  }
  else {
    auVar3 = vsqrtsd_avx(auVar3,auVar3);
    dVar2 = auVar3._0_8_;
  }
  *transl_err = dVar1 / dVar2;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::relative_error(
    double & rot_err,
    double & transl_err,
    const double Rtrue[3][3],
    const double ttrue[3],
    const double Rest[3][3],
    const double test[3])
{
  double qtrue[4], qest[4];

  mat_to_quat(Rtrue, qtrue);
  mat_to_quat(Rest, qest);

  double rot_err1 = sqrt((qtrue[0] - qest[0]) * (qtrue[0] - qest[0]) +
                         (qtrue[1] - qest[1]) * (qtrue[1] - qest[1]) +
                         (qtrue[2] - qest[2]) * (qtrue[2] - qest[2]) +
                         (qtrue[3] - qest[3]) * (qtrue[3] - qest[3])) /
                    sqrt(qtrue[0] * qtrue[0] +
                         qtrue[1] * qtrue[1] +
                         qtrue[2] * qtrue[2] +
                         qtrue[3] * qtrue[3]);

  double rot_err2 = sqrt((qtrue[0] + qest[0]) * (qtrue[0] + qest[0]) +
                         (qtrue[1] + qest[1]) * (qtrue[1] + qest[1]) +
                         (qtrue[2] + qest[2]) * (qtrue[2] + qest[2]) +
                         (qtrue[3] + qest[3]) * (qtrue[3] + qest[3]) ) /
                    sqrt(qtrue[0] * qtrue[0] +
                         qtrue[1] * qtrue[1] +
                         qtrue[2] * qtrue[2] +
                         qtrue[3] * qtrue[3]);

  rot_err = min(rot_err1,rot_err2);

  transl_err = sqrt((ttrue[0] - test[0]) * (ttrue[0] - test[0]) +
                    (ttrue[1] - test[1]) * (ttrue[1] - test[1]) +
                    (ttrue[2] - test[2]) * (ttrue[2] - test[2])) /
               sqrt(ttrue[0] * ttrue[0] +
                    ttrue[1] * ttrue[1] +
                    ttrue[2] * ttrue[2]);
}